

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryScene(aiScene *scene)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  aiCamera *cam;
  uint i_5;
  aiLight *l;
  uint i_4;
  aiTexture *mesh_1;
  uint i_3;
  aiAnimation *anim;
  uint i_2;
  aiMaterial *mat;
  uint i_1;
  aiMesh *mesh;
  uint i;
  uint32_t old;
  uint32_t len;
  aiScene *scene_local;
  
  ofs = WriteMagic(0x1239);
  uVar1 = Write<unsigned_int>(&scene->mFlags);
  uVar2 = Write<unsigned_int>(&scene->mNumMeshes);
  uVar3 = Write<unsigned_int>(&scene->mNumMaterials);
  uVar4 = Write<unsigned_int>(&scene->mNumAnimations);
  uVar5 = Write<unsigned_int>(&scene->mNumTextures);
  uVar6 = Write<unsigned_int>(&scene->mNumLights);
  uVar7 = Write<unsigned_int>(&scene->mNumCameras);
  uVar8 = WriteBinaryNode(scene->mRootNode);
  i = uVar8 + 8 + uVar7 + uVar6 + uVar5 + uVar4 + uVar3 + uVar2 + uVar1;
  for (mesh._4_4_ = 0; mesh._4_4_ < scene->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
    uVar1 = WriteBinaryMesh(scene->mMeshes[mesh._4_4_]);
    i = uVar1 + 8 + i;
  }
  for (mat._4_4_ = 0; mat._4_4_ < scene->mNumMaterials; mat._4_4_ = mat._4_4_ + 1) {
    uVar1 = WriteBinaryMaterial(scene->mMaterials[mat._4_4_]);
    i = uVar1 + 8 + i;
  }
  for (anim._4_4_ = 0; anim._4_4_ < scene->mNumAnimations; anim._4_4_ = anim._4_4_ + 1) {
    uVar1 = WriteBinaryAnim(scene->mAnimations[anim._4_4_]);
    i = uVar1 + 8 + i;
  }
  for (mesh_1._4_4_ = 0; mesh_1._4_4_ < scene->mNumTextures; mesh_1._4_4_ = mesh_1._4_4_ + 1) {
    uVar1 = WriteBinaryTexture(scene->mTextures[mesh_1._4_4_]);
    i = uVar1 + 8 + i;
  }
  for (l._4_4_ = 0; l._4_4_ < scene->mNumLights; l._4_4_ = l._4_4_ + 1) {
    uVar1 = WriteBinaryLight(scene->mLights[l._4_4_]);
    i = uVar1 + 8 + i;
  }
  for (cam._4_4_ = 0; cam._4_4_ < scene->mNumCameras; cam._4_4_ = cam._4_4_ + 1) {
    uVar1 = WriteBinaryCamera(scene->mCameras[cam._4_4_]);
    i = uVar1 + 8 + i;
  }
  ChangeInteger(ofs,i);
  return i;
}

Assistant:

uint32_t WriteBinaryScene(const aiScene* scene)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AISCENE);

	// basic scene information
	len += Write<unsigned int>(scene->mFlags);
	len += Write<unsigned int>(scene->mNumMeshes);
	len += Write<unsigned int>(scene->mNumMaterials);
	len += Write<unsigned int>(scene->mNumAnimations);
	len += Write<unsigned int>(scene->mNumTextures);
	len += Write<unsigned int>(scene->mNumLights);
	len += Write<unsigned int>(scene->mNumCameras);
	
	// write node graph
	len += WriteBinaryNode(scene->mRootNode)+8;

	// write all meshes
	for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
		const aiMesh* mesh = scene->mMeshes[i];
		len += WriteBinaryMesh(mesh)+8;
	}

	// write materials
	for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
		const aiMaterial* mat = scene->mMaterials[i];
		len += WriteBinaryMaterial(mat)+8;
	}

	// write all animations
	for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
		const aiAnimation* anim = scene->mAnimations[i];
		len += WriteBinaryAnim(anim)+8;
	}


	// write all textures
	for (unsigned int i = 0; i < scene->mNumTextures;++i) {
		const aiTexture* mesh = scene->mTextures[i];
		len += WriteBinaryTexture(mesh)+8;
	}

	// write lights
	for (unsigned int i = 0; i < scene->mNumLights;++i) {
		const aiLight* l = scene->mLights[i];
		len += WriteBinaryLight(l)+8;
	}

	// write cameras
	for (unsigned int i = 0; i < scene->mNumCameras;++i) {
		const aiCamera* cam = scene->mCameras[i];
		len += WriteBinaryCamera(cam)+8;
	}

	ChangeInteger(old,len);
	return len;
}